

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  string *psVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  Descriptor *pDVar4;
  MethodOptions *pMVar5;
  MethodOptions *pMVar6;
  MethodDescriptorProto *proto_local;
  MethodDescriptor *this_local;
  
  psVar1 = name_abi_cxx11_(this);
  puVar2 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
  *puVar2 = *puVar2 | 1;
  pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
  internal::ArenaStringPtr::Set(&proto->name_,psVar1,pAVar3);
  pDVar4 = input_type(this);
  if (((byte)pDVar4[1] >> 1 & 1) == 0) {
    puVar2 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
    *puVar2 = *puVar2 | 2;
    pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->input_type_,".",pAVar3);
  }
  psVar1 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(proto);
  pDVar4 = input_type(this);
  Descriptor::full_name_abi_cxx11_(pDVar4);
  std::__cxx11::string::append((string *)psVar1);
  pDVar4 = output_type(this);
  if (((byte)pDVar4[1] >> 1 & 1) == 0) {
    puVar2 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
    *puVar2 = *puVar2 | 4;
    pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->output_type_,".",pAVar3);
  }
  psVar1 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(proto);
  pDVar4 = output_type(this);
  Descriptor::full_name_abi_cxx11_(pDVar4);
  std::__cxx11::string::append((string *)psVar1);
  pMVar5 = options(this);
  pMVar6 = MethodOptions::default_instance();
  if (pMVar5 != pMVar6) {
    pMVar5 = MethodDescriptorProto::mutable_options(proto);
    pMVar6 = options(this);
    MethodOptions::CopyFrom(pMVar5,pMVar6);
  }
  if (((byte)this[1] & 1) != 0) {
    MethodDescriptorProto::set_client_streaming(proto,true);
  }
  if (((byte)this[2] & 1) != 0) {
    MethodDescriptorProto::set_server_streaming(proto,true);
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}